

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_type __thiscall llvm::StringRef::find_last_not_of(StringRef *this,char C,size_t From)

{
  long lVar1;
  size_type sVar2;
  
  if (this->Length < From) {
    From = this->Length;
  }
  do {
    sVar2 = From - 1;
    if (From == 0) {
      return 0xffffffffffffffff;
    }
    lVar1 = From - 1;
    From = sVar2;
  } while (this->Data[lVar1] == C);
  return sVar2;
}

Assistant:

StringRef::size_type StringRef::find_last_not_of(char C, size_t From) const {
  for (size_type i = std::min(From, Length) - 1, e = -1; i != e; --i)
    if (Data[i] != C)
      return i;
  return npos;
}